

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadSpotLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  pointer pcVar1;
  undefined8 *in_RDX;
  XMLLoader *this_00;
  string *childID;
  XMLLoader *this_01;
  XMLLoader *this_02;
  Vec3fa VVar2;
  Vec3fa I;
  AffineSpace3fa space;
  undefined1 local_a8 [12];
  float local_9c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  undefined1 auStack_40 [24];
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  this_01 = (XMLLoader *)local_a8;
  this_02 = (XMLLoader *)local_a8;
  this_00 = (XMLLoader *)*in_RDX;
  local_88._0_2_ = 0x6641;
  local_88._2_5_ = 0x53656e6966;
  local_88[7] = 0x70;
  local_88[8] = 0x61;
  local_88._9_2_ = 0x6563;
  local_98._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xb;
  local_88[0xb] = 0;
  local_98._M_allocated_capacity = (size_type)(element_type *)local_88;
  XML::child((XML *)local_78,(string *)this_00);
  load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
            ((AffineSpace3fa *)&local_58.field_1,this_00,(Ref<embree::XML> *)local_78);
  if ((long *)local_78._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_78._0_8_ + 0x18))();
  }
  if ((element_type *)local_98._M_allocated_capacity != (element_type *)local_88) {
    operator_delete((void *)local_98._M_allocated_capacity);
  }
  childID = (string *)*in_RDX;
  local_88._0_2_ = 0x49;
  local_98._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_98._M_allocated_capacity = (size_type)(element_type *)local_88;
  XML::child((XML *)local_a8,childID);
  VVar2 = load<embree::Vec3fa>((XMLLoader *)local_78,(Ref<embree::XML> *)childID);
  if ((_func_int **)local_a8._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_a8._0_8_ + 0x18))(VVar2.field_0._0_4_,VVar2.field_0._8_4_);
  }
  if ((element_type *)local_98._M_allocated_capacity != (element_type *)local_88) {
    operator_delete((void *)local_98._M_allocated_capacity);
  }
  local_88._0_2_ = 0x6e61;
  local_88._2_5_ = 0x694d656c67;
  local_88[7] = 0x6e;
  local_98._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x8;
  local_88[8] = 0;
  local_98._M_allocated_capacity = (size_type)(element_type *)local_88;
  XML::child((XML *)local_a8,(string *)*in_RDX);
  local_9c = load<float>(this_01,(Ref<embree::XML> *)local_a8);
  if ((_func_int **)local_a8._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_a8._0_8_ + 0x18))();
  }
  if ((element_type *)local_98._M_allocated_capacity != (element_type *)local_88) {
    operator_delete((void *)local_98._M_allocated_capacity);
  }
  local_88._0_2_ = 0x6e61;
  local_88._2_5_ = 0x614d656c67;
  local_88[7] = 0x78;
  local_98._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x8;
  local_88[8] = 0;
  local_98._M_allocated_capacity = (size_type)(element_type *)local_88;
  XML::child((XML *)local_a8,(string *)*in_RDX);
  local_a8._8_4_ = load<float>(this_02,(Ref<embree::XML> *)local_a8);
  if ((_func_int **)local_a8._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_a8._0_8_ + 0x18))();
  }
  if ((element_type *)local_98._M_allocated_capacity != (element_type *)local_88) {
    operator_delete((void *)local_98._M_allocated_capacity);
  }
  local_68._M_allocated_capacity = local_78._0_8_;
  local_68._8_8_ = local_78._8_8_;
  pcVar1 = (pointer)alignedMalloc(0xc0,0x10);
  pcVar1[8] = '\0';
  pcVar1[9] = '\0';
  pcVar1[10] = '\0';
  pcVar1[0xb] = '\0';
  pcVar1[0xc] = '\0';
  pcVar1[0xd] = '\0';
  pcVar1[0xe] = '\0';
  pcVar1[0xf] = '\0';
  *(pointer *)(pcVar1 + 0x10) = pcVar1 + 0x20;
  pcVar1[0x18] = '\0';
  pcVar1[0x19] = '\0';
  pcVar1[0x1a] = '\0';
  pcVar1[0x1b] = '\0';
  pcVar1[0x1c] = '\0';
  pcVar1[0x1d] = '\0';
  pcVar1[0x1e] = '\0';
  pcVar1[0x1f] = '\0';
  pcVar1[0x20] = '\0';
  *(pointer *)(pcVar1 + 0x30) = pcVar1 + 0x40;
  pcVar1[0x38] = '\0';
  pcVar1[0x39] = '\0';
  pcVar1[0x3a] = '\0';
  pcVar1[0x3b] = '\0';
  pcVar1[0x3c] = '\0';
  pcVar1[0x3d] = '\0';
  pcVar1[0x3e] = '\0';
  pcVar1[0x3f] = '\0';
  pcVar1[0x40] = '\0';
  pcVar1[0x50] = '\0';
  pcVar1[0x51] = '\0';
  pcVar1[0x52] = '\0';
  pcVar1[0x53] = '\0';
  pcVar1[0x54] = '\0';
  pcVar1[0x55] = '\0';
  pcVar1[0x56] = '\0';
  pcVar1[0x57] = '\0';
  pcVar1[0x58] = '\0';
  pcVar1[0x59] = '\0';
  pcVar1[0x5c] = -1;
  pcVar1[0x5d] = -1;
  pcVar1[0x5e] = -1;
  pcVar1[0x5f] = -1;
  pcVar1[0x60] = '\0';
  pcVar1[0x61] = '\0';
  pcVar1[0x62] = '\0';
  pcVar1[99] = '\0';
  pcVar1[100] = '\0';
  pcVar1[0x65] = '\0';
  pcVar1[0x66] = '\0';
  pcVar1[0x67] = '\0';
  *(undefined ***)pcVar1 = &PTR__Node_002cdf20;
  pcVar1[0x70] = '\x03';
  pcVar1[0x71] = '\0';
  pcVar1[0x72] = '\0';
  pcVar1[0x73] = '\0';
  *(float *)(pcVar1 + 0x80) =
       (float)auStack_40._8_4_ * 0.0 + local_28 + local_48 * 0.0 + local_58.m128[0] * 0.0;
  *(float *)(pcVar1 + 0x84) =
       (float)auStack_40._12_4_ * 0.0 + fStack_24 + fStack_44 * 0.0 + local_58.m128[1] * 0.0;
  *(float *)(pcVar1 + 0x88) =
       (float)auStack_40._16_4_ * 0.0 + fStack_20 + (float)auStack_40._0_4_ * 0.0 +
       local_58.m128[2] * 0.0;
  *(float *)(pcVar1 + 0x8c) =
       (float)auStack_40._20_4_ * 0.0 + fStack_1c + (float)auStack_40._4_4_ * 0.0 +
       local_58.m128[3] * 0.0;
  *(float *)(pcVar1 + 0x90) = local_48 * 0.0 + (float)auStack_40._8_4_ + local_58.m128[0] * 0.0;
  *(float *)(pcVar1 + 0x94) = fStack_44 * 0.0 + (float)auStack_40._12_4_ + local_58.m128[1] * 0.0;
  *(float *)(pcVar1 + 0x98) =
       (float)auStack_40._0_4_ * 0.0 + (float)auStack_40._16_4_ + local_58.m128[2] * 0.0;
  *(float *)(pcVar1 + 0x9c) =
       (float)auStack_40._4_4_ * 0.0 + (float)auStack_40._20_4_ + local_58.m128[3] * 0.0;
  *(size_type *)(pcVar1 + 0xa0) = local_68._M_allocated_capacity;
  *(undefined8 *)(pcVar1 + 0xa8) = local_68._8_8_;
  *(float *)(pcVar1 + 0xb0) = local_9c;
  *(undefined4 *)(pcVar1 + 0xb4) = local_a8._8_4_;
  (this->path).filename._M_dataplus._M_p = pcVar1;
  LOCK();
  *(long *)(pcVar1 + 8) = *(long *)(pcVar1 + 8) + 1;
  UNLOCK();
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadSpotLight(const Ref<XML>& xml) 
  {
    const AffineSpace3fa space = load<AffineSpace3fa>(xml->child("AffineSpace"));
    const Vec3fa I = load<Vec3fa>(xml->child("I"));
    const Vec3fa P = Vec3fa(zero);
    const Vec3fa D = Vec3fa(0,0,1);
    const float angleMin = load<float>(xml->child("angleMin"));
    const float angleMax = load<float>(xml->child("angleMax"));
    const SceneGraph::SpotLight light = SceneGraph::SpotLight(P,D,I,angleMin,angleMax);
    return new SceneGraph::LightNodeImpl<SceneGraph::SpotLight>(light.transform(space));
  }